

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcPrint.c
# Opt level: O1

void Mvc_CoverPrintBinary(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  byte bVar2;
  int __c;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  printf("The cover contains %d cubes (%d bits and %d words)\n",(ulong)(uint)(pCover->lCubes).nItems
         ,(ulong)(uint)pCover->nBits,(ulong)(uint)pCover->nWords);
  pMVar1 = (pCover->lCubes).pHead;
  do {
    if (pMVar1 == (Mvc_Cube_t *)0x0) {
      if (pCover->pLits != (int *)0x0) {
        if (0 < pCover->nBits) {
          lVar5 = 0;
          do {
            printf(" %d",(ulong)(uint)pCover->pLits[lVar5]);
            lVar5 = lVar5 + 1;
          } while (lVar5 < pCover->nBits);
        }
        putchar(10);
      }
      puts("End of cover printout");
      return;
    }
    if (1 < pCover->nBits) {
      bVar2 = 0;
      uVar4 = 0;
      do {
        switch(pMVar1->pData[uVar4 >> 4] >> (bVar2 & 0x1e) & 3) {
        case 0:
          goto switchD_0040c3b0_caseD_0;
        case 1:
          __c = 0x30;
          break;
        case 2:
          __c = 0x31;
          break;
        case 3:
          __c = 0x2d;
        }
        putchar(__c);
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        bVar2 = bVar2 + 2;
      } while ((int)uVar3 < pCover->nBits / 2);
    }
switchD_0040c3b0_caseD_0:
    putchar(10);
    pMVar1 = pMVar1->pNext;
  } while( true );
}

Assistant:

void Mvc_CoverPrintBinary( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int i;
    // print general statistics
    printf( "The cover contains %d cubes (%d bits and %d words)\n", 
        pCover->lCubes.nItems, pCover->nBits, pCover->nWords );
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubePrintBinary( pCover, pCube );

    if ( pCover->pLits )
    {
        for ( i = 0; i < pCover->nBits; i++ )
            printf( " %d", pCover->pLits[i] );
        printf( "\n" ); 
    }
    printf( "End of cover printout\n" ); 
}